

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLhs(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int i,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *newLhs,bool scale)

{
  uint *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  undefined7 in_register_00000009;
  cpp_dec_float<50U,_int,_void> local_90;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined8 local_38;
  int local_30;
  undefined1 local_2c;
  undefined8 local_28;
  
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_90,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator>
                      (newLhs,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_90);
    if (tVar3) {
      local_38 = *(undefined8 *)((newLhs->m_backend).data._M_elems + 8);
      local_58 = (newLhs->m_backend).data._M_elems[0];
      uStack_54 = (newLhs->m_backend).data._M_elems[1];
      uStack_50 = (newLhs->m_backend).data._M_elems[2];
      uStack_4c = (newLhs->m_backend).data._M_elems[3];
      local_48 = (newLhs->m_backend).data._M_elems[4];
      uStack_44 = (newLhs->m_backend).data._M_elems[5];
      uStack_40 = (newLhs->m_backend).data._M_elems[6];
      uStack_3c = (newLhs->m_backend).data._M_elems[7];
      local_30 = (newLhs->m_backend).exp;
      local_2c = (newLhs->m_backend).neg;
      local_28._0_4_ = (newLhs->m_backend).fpclass;
      local_28._4_4_ = (newLhs->m_backend).prec_elem;
      (*this->lp_scaler->_vptr_SPxScaler[0x2d])(&local_90,this->lp_scaler,this,i);
      pnVar2 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar2[i].m_backend.data._M_elems + 8) = local_90.data._M_elems._32_8_;
      puVar1 = pnVar2[i].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_90.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_90.data._M_elems._24_8_;
      *(undefined8 *)&pnVar2[i].m_backend.data = local_90.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[i].m_backend.data._M_elems + 2) = local_90.data._M_elems._8_8_;
      pnVar2[i].m_backend.exp = local_90.exp;
      pnVar2[i].m_backend.neg = local_90.neg;
      pnVar2[i].m_backend.fpclass = local_90.fpclass;
      pnVar2[i].m_backend.prec_elem = local_90.prec_elem;
      return;
    }
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newLhs->m_backend);
  return;
}

Assistant:

virtual void changeLhs(int i, const R& newLhs, bool scale = false)
   {
      if(scale && newLhs > R(-infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPRowSetBase<R>::lhs_w(i) = lp_scaler->scaleLhs(*this, i, newLhs);
      }
      else
         LPRowSetBase<R>::lhs_w(i) = newLhs;

      assert(isConsistent());
   }